

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeAnyValue
          (ParserImpl *this,string *full_type_name,DescriptorPool *pool,string *serialized_value)

{
  bool bVar1;
  int iVar2;
  Descriptor *type;
  Message *pMVar3;
  undefined4 extraout_var;
  MessageLite *pMVar4;
  scoped_ptr<google::protobuf::Message> value;
  string sub_delimiter;
  DynamicMessageFactory factory;
  scoped_ptr<google::protobuf::Message> local_e0;
  string local_d8;
  DynamicMessageFactory local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  type = DescriptorPool::FindMessageTypeByName(pool,full_type_name);
  if (type == (Descriptor *)0x0) {
    std::operator+(&local_d8,"Could not find type \"",full_type_name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8,
                   &local_d8,"\" stored in google.protobuf.Any.");
    ReportError(this,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    return false;
  }
  DynamicMessageFactory::DynamicMessageFactory(&local_b8);
  pMVar3 = DynamicMessageFactory::GetPrototype(&local_b8,type);
  if (pMVar3 == (Message *)0x0) {
    bVar1 = false;
    goto LAB_0032f5eb;
  }
  iVar2 = (*(pMVar3->super_MessageLite)._vptr_MessageLite[3])(pMVar3);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  local_e0.ptr_ = (Message *)CONCAT44(extraout_var,iVar2);
  bVar1 = ConsumeMessageDelimiter(this,&local_d8);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_50,(string *)&local_d8);
    bVar1 = ConsumeMessage(this,(Message *)CONCAT44(extraout_var,iVar2),&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (!bVar1) goto LAB_0032f5cf;
    bVar1 = this->allow_partial_;
    pMVar4 = &internal::scoped_ptr<google::protobuf::Message>::operator->(&local_e0)->
              super_MessageLite;
    if (bVar1 == true) {
      bVar1 = true;
      MessageLite::AppendPartialToString(pMVar4,serialized_value);
    }
    else {
      iVar2 = (*pMVar4->_vptr_MessageLite[8])(pMVar4);
      if ((char)iVar2 == '\0') {
        std::operator+(&local_90,"Value of type \"",full_type_name);
        std::operator+(&local_70,&local_90,
                       "\" stored in google.protobuf.Any has missing required fields");
        ReportError(this,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
        goto LAB_0032f5cf;
      }
      pMVar4 = &internal::scoped_ptr<google::protobuf::Message>::operator->(&local_e0)->
                super_MessageLite;
      bVar1 = true;
      MessageLite::AppendToString(pMVar4,serialized_value);
    }
  }
  else {
LAB_0032f5cf:
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&local_d8);
  if (local_e0.ptr_ != (Message *)0x0) {
    (*((local_e0.ptr_)->super_MessageLite)._vptr_MessageLite[1])();
  }
LAB_0032f5eb:
  DynamicMessageFactory::~DynamicMessageFactory(&local_b8);
  return bVar1;
}

Assistant:

bool ConsumeAnyValue(const string& full_type_name, const DescriptorPool* pool,
                       string* serialized_value) {
    const Descriptor* value_descriptor =
        pool->FindMessageTypeByName(full_type_name);
    if (value_descriptor == NULL) {
      ReportError("Could not find type \"" + full_type_name +
                  "\" stored in google.protobuf.Any.");
      return false;
    }
    DynamicMessageFactory factory;
    const Message* value_prototype = factory.GetPrototype(value_descriptor);
    if (value_prototype == NULL) {
      return false;
    }
    google::protobuf::scoped_ptr<Message> value(value_prototype->New());
    string sub_delimiter;
    DO(ConsumeMessageDelimiter(&sub_delimiter));
    DO(ConsumeMessage(value.get(), sub_delimiter));

    if (allow_partial_) {
      value->AppendPartialToString(serialized_value);
    } else {
      if (!value->IsInitialized()) {
        ReportError(
            "Value of type \"" + full_type_name +
            "\" stored in google.protobuf.Any has missing required fields");
        return false;
      }
      value->AppendToString(serialized_value);
    }
    return true;
  }